

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

ElementsDecodeLockingScript * __thiscall
cfd::api::json::ElementsDecodeLockingScript::operator=
          (ElementsDecodeLockingScript *this,ElementsDecodeLockingScript *param_2)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  ElementsDecodeLockingScript *in_RDI;
  
  core::JsonClassBase<cfd::api::json::ElementsDecodeLockingScript>::operator=
            (&in_RDI->super_JsonClassBase<cfd::api::json::ElementsDecodeLockingScript>,
             (JsonClassBase<cfd::api::json::ElementsDecodeLockingScript> *)in_RSI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_RSI,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->asm__,(string *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->hex_,
             (string *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count);
  in_RDI->req_sigs_ = *(int *)&in_RSI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::operator=
            ((string *)&in_RDI->type_,
             (string *)&in_RSI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RSI,
              (JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RDI);
  std::__cxx11::string::operator=((string *)&in_RDI->pegout_chain_,(string *)(in_RSI + 4));
  std::__cxx11::string::operator=
            ((string *)&in_RDI->pegout_asm_,
             (string *)&in_RSI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->pegout_hex_,
             (string *)&in_RSI[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  in_RDI->pegout_req_sigs_ = *(int *)&in_RSI[6]._M_t._M_impl;
  std::__cxx11::string::operator=
            ((string *)&in_RDI->pegout_type_,(string *)&in_RSI[6]._M_t._M_impl.super__Rb_tree_header
            );
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RSI,
              (JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RDI);
  return in_RDI;
}

Assistant:

ElementsDecodeLockingScript() {
    CollectFieldName();
  }